

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::FullRangeNeeded(Polygon *pts)

{
  size_type sVar1;
  const_reference pvVar2;
  long64 lVar3;
  undefined8 *puVar4;
  ulong local_20;
  size_type i;
  bool result;
  Polygon *pts_local;
  
  i._7_1_ = false;
  local_20 = 0;
  do {
    sVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size(pts);
    if (sVar1 <= local_20) {
      return i._7_1_;
    }
    pvVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (pts,local_20);
    lVar3 = Abs(pvVar2->X);
    if (0x3fffffffffffffff < lVar3) {
LAB_00b1bfe2:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "Coordinate exceeds range bounds.";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    pvVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (pts,local_20);
    lVar3 = Abs(pvVar2->Y);
    if (0x3fffffffffffffff < lVar3) goto LAB_00b1bfe2;
    pvVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (pts,local_20);
    lVar3 = Abs(pvVar2->X);
    if (lVar3 < 0x40000000) {
      pvVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (pts,local_20);
      lVar3 = Abs(pvVar2->Y);
      if (0x3fffffff < lVar3) goto LAB_00b1c044;
    }
    else {
LAB_00b1c044:
      i._7_1_ = true;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool FullRangeNeeded(const Polygon &pts)
{
  bool result = false;
  for (Polygon::size_type i = 0; i <  pts.size(); ++i)
  {
    if (Abs(pts[i].X) > hiRange || Abs(pts[i].Y) > hiRange)
        throw "Coordinate exceeds range bounds.";
      else if (Abs(pts[i].X) > loRange || Abs(pts[i].Y) > loRange)
        result = true;
  }
  return result;
}